

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chimp_fetch.hpp
# Opt level: O3

void duckdb::ChimpFetchRow<double>
               (ColumnSegment *segment,ColumnFetchState *state,row_t row_id,Vector *result,
               idx_t result_idx)

{
  data_ptr_t pdVar1;
  ChimpScanState<double> scan_state;
  ChimpScanState<double> CStack_238c8;
  
  ChimpScanState<double>::ChimpScanState(&CStack_238c8,segment);
  ChimpScanState<double>::Skip(&CStack_238c8,segment,row_id);
  pdVar1 = result->data;
  if (((CStack_238c8.total_value_count & 0x3ff) == 0) &&
     (CStack_238c8.total_value_count < CStack_238c8.segment_count)) {
    ChimpScanState<double>::LoadGroup(&CStack_238c8,CStack_238c8.group_state.values);
  }
  *(unsigned_long *)(pdVar1 + result_idx * 8) =
       CStack_238c8.group_state.values[CStack_238c8.group_state.index];
  BufferHandle::~BufferHandle(&CStack_238c8.handle);
  return;
}

Assistant:

void ChimpFetchRow(ColumnSegment &segment, ColumnFetchState &state, row_t row_id, Vector &result, idx_t result_idx) {
	using INTERNAL_TYPE = typename ChimpType<T>::TYPE;

	ChimpScanState<T> scan_state(segment);
	scan_state.Skip(segment, UnsafeNumericCast<idx_t>(row_id));
	auto result_data = FlatVector::GetData<INTERNAL_TYPE>(result);

	if (scan_state.GroupFinished() && scan_state.total_value_count < scan_state.segment_count) {
		scan_state.LoadGroup(scan_state.group_state.values);
	}
	scan_state.group_state.Scan(&result_data[result_idx], 1);

	scan_state.total_value_count++;
}